

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O1

int mk_http_keepalive_check(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (server->keep_alive == '\0') {
    return -1;
  }
  iVar1 = sr->protocol;
  if (iVar1 == 10) {
    iVar2 = 1;
  }
  else {
    if (iVar1 != 0xb) goto LAB_0010ab06;
    iVar2 = 0;
  }
  cs->close_now = iVar2;
LAB_0010ab06:
  if ((sr->connection).data != (char *)0x0) {
    iVar2 = (cs->parser).header_connection;
    iVar3 = 0;
    if ((iVar1 == 0xb && iVar2 == 1) || (iVar3 = 1, iVar2 == 2)) {
      cs->close_now = iVar3;
    }
  }
  iVar1 = 0;
  if (server->max_keep_alive_request <= cs->counter_connections) {
    cs->close_now = 1;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int mk_http_keepalive_check(struct mk_http_session *cs,
                            struct mk_http_request *sr,
                            struct mk_server *server)
{
    if (server->keep_alive == MK_FALSE) {
        return -1;
    }

    /* Default Keepalive is off */
    if (sr->protocol == MK_HTTP_PROTOCOL_10) {
        cs->close_now = MK_TRUE;
    }
    else if (sr->protocol == MK_HTTP_PROTOCOL_11) {
        cs->close_now = MK_FALSE;
    }

    if (sr->connection.data) {
        if (cs->parser.header_connection == MK_HTTP_PARSER_CONN_KA &&
            sr->protocol == MK_HTTP_PROTOCOL_11) {
            cs->close_now  = MK_FALSE;
        }
        else if (cs->parser.header_connection == MK_HTTP_PARSER_CONN_CLOSE) {
            cs->close_now  = MK_TRUE;
        }
    }

    /* Client has reached keep-alive connections limit */
    if (cs->counter_connections >= server->max_keep_alive_request) {
        cs->close_now = MK_TRUE;
        return -1;
    }

    return 0;
}